

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O3

void read_sei_payload(h264_stream_t *h,bs_t *b)

{
  sei_t *psVar1;
  sei_scalability_info_t *psVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  byte *pbVar7;
  byte bVar8;
  uint32_t r;
  uint uVar10;
  bool bVar11;
  uint uVar9;
  
  psVar1 = h->sei;
  if (psVar1->payloadType == 0x18) {
    psVar2 = (sei_scalability_info_t *)calloc(1,0x6fa0c);
    (psVar1->field_2).sei_svc = psVar2;
    read_sei_scalability_info(h,b);
    return;
  }
  iVar4 = psVar1->payloadSize;
  psVar2 = (sei_scalability_info_t *)calloc(1,(long)iVar4);
  (psVar1->field_2).sei_svc = psVar2;
  if (0 < (long)iVar4) {
    lVar3 = 0;
    do {
      uVar6 = b->bits_left;
      if (uVar6 == 8) {
        pbVar5 = b->p;
        pbVar7 = b->end;
        if (pbVar7 <= pbVar5) goto LAB_00141444;
        bVar8 = *pbVar5;
        b->p = pbVar5 + 1;
      }
      else {
        pbVar5 = b->p;
        pbVar7 = b->end;
LAB_00141444:
        uVar9 = 0;
        iVar4 = 7;
        do {
          uVar6 = uVar6 - 1;
          b->bits_left = uVar6;
          uVar10 = 0;
          if (pbVar5 < pbVar7) {
            uVar10 = (uint)((*pbVar5 >> (uVar6 & 0x1f) & 1) != 0);
          }
          if (uVar6 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar6 = 8;
          }
          uVar9 = uVar9 | uVar10 << ((byte)iVar4 & 0x1f);
          bVar8 = (byte)uVar9;
          bVar11 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar11);
      }
      *(byte *)((long)((psVar1->field_2).sei_svc)->layers[0].roi + lVar3 + -0x4a) = bVar8;
      lVar3 = lVar3 + 1;
    } while (lVar3 < psVar1->payloadSize);
  }
  return;
}

Assistant:

void read_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 1 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            read_sei_scalability_info( h, b );
            break;
        default:
            if( 1 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                s->data[i] = bs_read_u8(b);
    }
    
    //if( 1 )
    //    read_sei_end_bits(h, b);
}